

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void initZxLikeDevice(CDevice *device,int32_t slotSize,int pageCount,int *initialPages,aint ramtop)

{
  aint local_88;
  byte value_2;
  uchar *__end1_2;
  uchar *__begin1_2;
  uchar (*__range1_2) [4];
  byte value_1;
  uchar *__end1_1;
  uchar *__begin1_1;
  uchar (*__range1_1) [256];
  byte value;
  uchar *__end1;
  uchar *__begin1;
  uchar (*__range1) [168];
  aint adr;
  aint ramtop_local;
  int *initialPages_local;
  int pageCount_local;
  int32_t slotSize_local;
  CDevice *device_local;
  
  initRegularSlotDevice(device,slotSize,(int32_t)(0x10000 / (long)slotSize),pageCount,initialPages);
  if ((ramtop < 0x5d00) || (local_88 = ramtop, 0xffff < ramtop)) {
    local_88 = 0x5d5b;
  }
  device->ZxRamTop = local_88;
  for (__range1._0_4_ = 0x5800; (int)__range1 < 0x5b00; __range1._0_4_ = (int)__range1 + 1) {
    CDevice::Poke(device,(int)__range1,'8');
  }
  __range1._0_4_ = 0xff58;
  for (__end1 = ""; __end1 != ""; __end1 = __end1 + 1) {
    CDevice::Poke(device,(int)__range1,*__end1);
    __range1._0_4_ = (int)__range1 + 1;
  }
  __range1._0_4_ = 0x5c00;
  for (__end1_1 = ZX_SYSVARS_DATA; __end1_1 != "\x03\x13"; __end1_1 = __end1_1 + 1) {
    CDevice::Poke(device,(int)__range1,*__end1_1);
    __range1._0_4_ = (int)__range1 + 1;
  }
  CDevice::Poke(device,0x5cb2,(byte)device->ZxRamTop);
  CDevice::Poke(device,0x5cb3,(byte)((uint)device->ZxRamTop >> 8));
  __range1._0_4_ = device->ZxRamTop + -3;
  CDevice::Poke(device,0x5c3d,(byte)(int)__range1);
  CDevice::Poke(device,0x5c3e,(byte)((uint)(int)__range1 >> 8));
  for (__end1_2 = "\x03\x13"; __end1_2 != ""; __end1_2 = __end1_2 + 1) {
    CDevice::Poke(device,(int)__range1,*__end1_2);
    __range1._0_4_ = (int)__range1 + 1;
  }
  return;
}

Assistant:

static void initZxLikeDevice(
	CDevice* const device, int32_t slotSize, int pageCount, const int* const initialPages, aint ramtop)
{
	initRegularSlotDevice(device, slotSize, 0x10000/slotSize, pageCount, initialPages);
	device->ZxRamTop = (0x5D00 <= ramtop && ramtop <= 0xFFFF) ? ramtop : ZX_RAMTOP_DEFAULT;

	// set memory to state like if (for snapshot saving):
		// CLEAR ZxRamTop (0x5D5B default) : LOAD "bin" CODE : ... USR start_adr
	aint adr;
	// ULA attributes: INK 0 : PAPER 7 : FLASH 0 : BRIGTH 0
	for (adr = 0x5800; adr < 0x5B00; ++adr) device->Poke(adr, 7*8);

	// set UDG data at ZX_UDG_ADR (0xFF58)
	adr = ZX_UDG_ADR;
	for (byte value : ZX_UDG_DATA) device->Poke(adr++, value);

	// ZX SYSVARS at 0x5C00
	adr = ZX_SYSVARS_ADR;
	for (byte value : ZX_SYSVARS_DATA) device->Poke(adr++, value);
	// set RAMTOP sysvar
	device->Poke(ZX_SYSVARS_ADR+0xB2, device->ZxRamTop & 0xFF);
	device->Poke(ZX_SYSVARS_ADR+0xB3, (device->ZxRamTop>>8) & 0xFF);

	// set STACK data (without the "start" address)
	adr = device->ZxRamTop + 1 - sizeof(ZX_STACK_DATA);
	// set ERRSP sysvar to beginning of the fake stack
	device->Poke(ZX_SYSVARS_ADR+0x3D, adr & 0xFF);
	device->Poke(ZX_SYSVARS_ADR+0x3E, (adr>>8) & 0xFF);
	for (byte value : ZX_STACK_DATA) device->Poke(adr++, value);
}